

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O0

Abc_Ntk_t * Io_ReadEqnNetwork(Extra_FileReader_t *p)

{
  char *pStr;
  FILE *pFile;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Vec_Ptr_t *vTokens_00;
  ProgressBar *p_00;
  void *pvVar3;
  size_t sVar4;
  char **pNamesIn;
  Abc_Obj_t *pAVar5;
  Hop_Obj_t *pHVar6;
  int local_68;
  int i;
  int iLine;
  char *pVarName;
  char *pFormulaCopy;
  char *pFormula;
  char *pNodeName;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vVars;
  Vec_Ptr_t *vTokens;
  ProgressBar *pProgress;
  Extra_FileReader_t *p_local;
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_AIG,1);
  pcVar2 = Extra_FileReaderGetFileName(p);
  pcVar2 = Extra_FileNameGeneric(pcVar2);
  pNtk_00->pName = pcVar2;
  pcVar2 = Extra_FileReaderGetFileName(p);
  pcVar2 = Extra_UtilStrsav(pcVar2);
  pNtk_00->pSpec = pcVar2;
  vTokens_00 = Vec_PtrAlloc(100);
  pFile = _stdout;
  iVar1 = Extra_FileReaderGetFileSize(p);
  p_00 = Extra_ProgressBarStart(pFile,iVar1);
  while (pvVar3 = Extra_FileReaderGetTokens(p), pvVar3 != (void *)0x0) {
    iVar1 = Extra_FileReaderGetCurPosition(p);
    Extra_ProgressBarUpdate(p_00,iVar1,(char *)0x0);
    Io_ReadEqnStrCompact((char *)**(undefined8 **)((long)pvVar3 + 8));
    sVar4 = strlen((char *)**(undefined8 **)((long)pvVar3 + 8));
    if (sVar4 == 0) break;
    if (*(int *)((long)pvVar3 + 4) != 2) {
      pcVar2 = Extra_FileReaderGetFileName(p);
      printf("%s: Wrong input file format.\n",pcVar2);
      Abc_NtkDelete(pNtk_00);
      return (Abc_Ntk_t *)0x0;
    }
    iVar1 = strncmp((char *)**(undefined8 **)((long)pvVar3 + 8),"INORDER",7);
    if (iVar1 == 0) {
      Io_ReadEqnStrCutAt(*(char **)(*(long *)((long)pvVar3 + 8) + 8)," \n\r\t",0,vTokens_00);
      for (local_68 = 0; iVar1 = Vec_PtrSize(vTokens_00), local_68 < iVar1; local_68 = local_68 + 1)
      {
        pcVar2 = (char *)Vec_PtrEntry(vTokens_00,local_68);
        Io_ReadCreatePi(pNtk_00,pcVar2);
      }
    }
    else {
      iVar1 = strncmp((char *)**(undefined8 **)((long)pvVar3 + 8),"OUTORDER",8);
      if (iVar1 == 0) {
        Io_ReadEqnStrCutAt(*(char **)(*(long *)((long)pvVar3 + 8) + 8)," \n\r\t",0,vTokens_00);
        for (local_68 = 0; iVar1 = Vec_PtrSize(vTokens_00), local_68 < iVar1;
            local_68 = local_68 + 1) {
          pcVar2 = (char *)Vec_PtrEntry(vTokens_00,local_68);
          Io_ReadCreatePo(pNtk_00,pcVar2);
        }
      }
      else {
        pcVar2 = (char *)**(undefined8 **)((long)pvVar3 + 8);
        pStr = *(char **)(*(long *)((long)pvVar3 + 8) + 8);
        Io_ReadEqnStrCompact(pStr);
        if ((pStr[1] == '\0') && ((*pStr == '0' || (*pStr == '1')))) {
          pVarName = (char *)0x0;
          Vec_PtrClear(vTokens_00);
        }
        else {
          pVarName = Extra_UtilStrsav(pStr);
          Io_ReadEqnStrCutAt(pVarName,"!*+()",1,vTokens_00);
        }
        pNamesIn = (char **)Vec_PtrArray(vTokens_00);
        iVar1 = Vec_PtrSize(vTokens_00);
        pAVar5 = Io_ReadCreateNode(pNtk_00,pcVar2,pNamesIn,iVar1);
        pHVar6 = Parse_FormulaParserEqn(_stdout,pStr,vTokens_00,(Hop_Man_t *)pNtk_00->pManFunc);
        (pAVar5->field_5).pData = pHVar6;
        if (pVarName != (char *)0x0) {
          free(pVarName);
        }
      }
    }
  }
  Extra_ProgressBarStop(p_00);
  Vec_PtrFree(vTokens_00);
  Abc_NtkFinalizeRead(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Io_ReadEqnNetwork( Extra_FileReader_t * p )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vTokens;
    Vec_Ptr_t * vVars;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    char * pNodeName, * pFormula, * pFormulaCopy, * pVarName;
    int iLine, i;
    
    // allocate the empty network
    pNtk = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_AIG, 1 );
    // set the specs
    pNtk->pName = Extra_FileNameGeneric(Extra_FileReaderGetFileName(p));
    pNtk->pSpec = Extra_UtilStrsav(Extra_FileReaderGetFileName(p));

    // go through the lines of the file
    vVars  = Vec_PtrAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Extra_FileReaderGetFileSize(p) );
    for ( iLine = 0; (vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p)); iLine++ )
    {
        Extra_ProgressBarUpdate( pProgress, Extra_FileReaderGetCurPosition(p), NULL );

        // check if the first token contains anything
        Io_ReadEqnStrCompact( (char *)vTokens->pArray[0] );
        if ( strlen((char *)vTokens->pArray[0]) == 0 )
            break;

        // if the number of tokens is different from two, error
        if ( vTokens->nSize != 2 )
        {
            printf( "%s: Wrong input file format.\n", Extra_FileReaderGetFileName(p) );
            Abc_NtkDelete( pNtk );
            return NULL;
        }

        // get the type of the line
        if ( strncmp( (char *)vTokens->pArray[0], "INORDER", 7 ) == 0 )
        {
            Io_ReadEqnStrCutAt( (char *)vTokens->pArray[1], " \n\r\t", 0, vVars );
            Vec_PtrForEachEntry( char *, vVars, pVarName, i )
                Io_ReadCreatePi( pNtk, pVarName );
        }
        else if ( strncmp( (char *)vTokens->pArray[0], "OUTORDER", 8 ) == 0 )
        {
            Io_ReadEqnStrCutAt( (char *)vTokens->pArray[1], " \n\r\t", 0, vVars );
            Vec_PtrForEachEntry( char *, vVars, pVarName, i )
                Io_ReadCreatePo( pNtk, pVarName );
        }
        else 
        {
            extern Hop_Obj_t * Parse_FormulaParserEqn( FILE * pOutput, char * pFormInit, Vec_Ptr_t * vVarNames, Hop_Man_t * pMan );

            // get hold of the node name and its formula
            pNodeName = (char *)vTokens->pArray[0];
            pFormula  = (char *)vTokens->pArray[1];
            // compact the formula 
            Io_ReadEqnStrCompact( pFormula );

            // consider the case of the constant node
            if ( pFormula[1] == 0 && (pFormula[0] == '0' || pFormula[0] == '1') )
            {
                pFormulaCopy = NULL;
                Vec_PtrClear( vVars );
            }
            else
            {
                // make a copy of formula for names
                pFormulaCopy = Extra_UtilStrsav( pFormula );
                // find the names of the fanins of this node
                Io_ReadEqnStrCutAt( pFormulaCopy, "!*+()", 1, vVars );
            }
            // create the node
            pNode = Io_ReadCreateNode( pNtk, pNodeName, (char **)Vec_PtrArray(vVars), Vec_PtrSize(vVars) );
            // derive the function
            pNode->pData = Parse_FormulaParserEqn( stdout, pFormula, vVars, (Hop_Man_t *)pNtk->pManFunc );
            // remove the cubes
            ABC_FREE( pFormulaCopy );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vVars );
    Abc_NtkFinalizeRead( pNtk );
    return pNtk;
}